

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32
laszip_set_geokeys(laszip_POINTER pointer,laszip_U32 number,laszip_geokey_struct *key_entries)

{
  laszip_I32 lVar1;
  laszip_U8 *data;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  if (pointer != (laszip_POINTER)0x0) {
    if (number == 0) {
      builtin_strncpy((char *)((long)pointer + 0x256),"entries ",8);
      builtin_strncpy((char *)((long)pointer + 0x25e),"is zero",8);
      uVar2._0_1_ = 'n';
      uVar2._1_1_ = 'u';
      uVar2._2_1_ = 'm';
      uVar2._3_1_ = 'b';
      uVar3._0_1_ = 'e';
      uVar3._1_1_ = 'r';
      uVar3._2_1_ = ' ';
      uVar3._3_1_ = 'o';
      uVar4._0_1_ = 'f';
      uVar4._1_1_ = ' ';
      uVar4._2_1_ = 'k';
      uVar4._3_1_ = 'e';
      uVar5._0_1_ = 'y';
      uVar5._1_1_ = '_';
      uVar5._2_1_ = 'e';
      uVar5._3_1_ = 'n';
    }
    else {
      if (key_entries == (laszip_geokey_struct *)0x0) {
        builtin_strncpy((char *)((long)pointer + 0x268),"y_entrie",8);
        builtin_strncpy((char *)((long)pointer + 0x270),"s\' is ze",8);
        builtin_strncpy((char *)((long)pointer + 600),"ruct poi",8);
        builtin_strncpy((char *)((long)pointer + 0x260),"nter \'ke",8);
        builtin_strncpy((char *)((long)pointer + 0x248),"laszip_g",8);
        builtin_strncpy((char *)((long)pointer + 0x250),"eokey_st",8);
        *(undefined4 *)((long)pointer + 0x277) = 0x6f7265;
        return 1;
      }
      if (*(long *)((long)pointer + 0x228) == 0) {
        if (*(long *)((long)pointer + 0x238) == 0) {
          data = (laszip_U8 *)operator_new__((ulong)(number + 1) << 3);
          data[0] = '\x01';
          data[1] = '\0';
          data[2] = '\x01';
          data[3] = '\0';
          data[4] = '\0';
          data[5] = '\0';
          *(short *)(data + 6) = (short)number;
          memcpy(data + 8,key_entries,(ulong)number << 3);
          lVar1 = laszip_add_vlr(pointer,"LASF_Projection",0x87af,(short)number * 8 + 8,
                                 (laszip_CHAR *)0x0,data);
          if (lVar1 != 0) {
            snprintf((char *)((long)pointer + 0x248),0x400,"setting %u geodouble_params",
                     (ulong)number);
            operator_delete__(data);
            return 1;
          }
          operator_delete__(data);
          *(undefined1 *)((long)pointer + 0x248) = 0;
          return 0;
        }
        builtin_strncpy((char *)((long)pointer + 0x263),"iter was",8);
        builtin_strncpy((char *)((long)pointer + 0x26b)," opened",8);
        builtin_strncpy((char *)((long)pointer + 600),"ys after",8);
        builtin_strncpy((char *)((long)pointer + 0x260)," writer ",8);
        uVar2._0_1_ = 'c';
        uVar2._1_1_ = 'a';
        uVar2._2_1_ = 'n';
        uVar2._3_1_ = 'n';
        uVar3._0_1_ = 'o';
        uVar3._1_1_ = 't';
        uVar3._2_1_ = ' ';
        uVar3._3_1_ = 's';
        uVar4._0_1_ = 'e';
        uVar4._1_1_ = 't';
        uVar4._2_1_ = ' ';
        uVar4._3_1_ = 'g';
        uVar5._0_1_ = 'e';
        uVar5._1_1_ = 'o';
        uVar5._2_1_ = 'k';
        uVar5._3_1_ = 'e';
      }
      else {
        builtin_strncpy((char *)((long)pointer + 0x263),"ader was",8);
        builtin_strncpy((char *)((long)pointer + 0x26b)," opened",8);
        builtin_strncpy((char *)((long)pointer + 600),"ys after",8);
        builtin_strncpy((char *)((long)pointer + 0x260)," reader ",8);
        uVar2._0_1_ = 'c';
        uVar2._1_1_ = 'a';
        uVar2._2_1_ = 'n';
        uVar2._3_1_ = 'n';
        uVar3._0_1_ = 'o';
        uVar3._1_1_ = 't';
        uVar3._2_1_ = ' ';
        uVar3._3_1_ = 's';
        uVar4._0_1_ = 'e';
        uVar4._1_1_ = 't';
        uVar4._2_1_ = ' ';
        uVar4._3_1_ = 'g';
        uVar5._0_1_ = 'e';
        uVar5._1_1_ = 'o';
        uVar5._2_1_ = 'k';
        uVar5._3_1_ = 'e';
      }
    }
    *(undefined4 *)((long)pointer + 0x248) = uVar2;
    *(undefined4 *)((long)pointer + 0x24c) = uVar3;
    *(undefined4 *)((long)pointer + 0x250) = uVar4;
    *(undefined4 *)((long)pointer + 0x254) = uVar5;
  }
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_set_geokeys(
    laszip_POINTER                     pointer
    , laszip_U32                       number
    , const laszip_geokey_struct*      key_entries
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (number == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "number of key_entries is zero");
      return 1;
    }

    if (key_entries == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_geokey_struct pointer 'key_entries' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geokeys after reader was opened");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geokeys after writer was opened");
      return 1;
    }

    // create the geokey directory

    laszip_geokey_struct* key_entries_plus_one = new laszip_geokey_struct[number+1];
    if (key_entries_plus_one == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "allocating laszip_geokey_struct[%u] array", number+1);
      return 1;
    }
    key_entries_plus_one[0].key_id = 1;            // aka key_directory_version
    key_entries_plus_one[0].tiff_tag_location = 1; // aka key_revision
    key_entries_plus_one[0].count = 0;             // aka minor_revision
    key_entries_plus_one[0].value_offset = number; // aka number_of_keys
    memcpy(key_entries_plus_one + 1, key_entries, sizeof(laszip_geokey_struct)*number);

    // add the VLR

    if (laszip_add_vlr(laszip_dll, "LASF_Projection", 34735, (laszip_U16)(8 + number*8), 0, (laszip_U8*)key_entries_plus_one))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "setting %u geodouble_params", number);
      delete [] key_entries_plus_one;
      return 1;
    }
    delete [] key_entries_plus_one;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_set_geokey_entries");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}